

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void __thiscall capnp::_::BuilderArena::LocalCapTable::dropCap(LocalCapTable *this,uint index)

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  Fault f;
  Own<capnp::ClientHook> local_18;
  
  pMVar1 = (this->capTable).builder.ptr;
  if ((ulong)index < (ulong)((long)(this->capTable).builder.pos - (long)pMVar1 >> 4)) {
    local_18.disposer = (Disposer *)0x0;
    local_18.ptr = (ClientHook *)0x0;
    kj::Own<capnp::ClientHook>::operator=(&pMVar1[index].ptr,&local_18);
    kj::Own<capnp::ClientHook>::dispose(&local_18);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
              ((Fault *)&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
               ,0x14a,FAILED,"index < capTable.size()",
               "\"Invalid capability descriptor in message.\"",
               (char (*) [42])"Invalid capability descriptor in message.");
    kj::_::Debug::Fault::~Fault((Fault *)&local_18);
  }
  return;
}

Assistant:

void BuilderArena::LocalCapTable::dropCap(uint index) {
  KJ_ASSERT(index < capTable.size(), "Invalid capability descriptor in message.") {
    return;
  }
  capTable[index] = nullptr;
}